

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Terrain.cpp
# Opt level: O1

void keyboardCallback(GLFWwindow *param_1,int key,int param_3,int action,int param_5)

{
  ImGuiIO *pIVar1;
  
  pIVar1 = ImGui::GetIO();
  if ((action == 1) && (pIVar1->WantCaptureKeyboard == false)) {
    if (key == 0x43) {
      if (g_app.recorder.on != 0) {
        g_app.recorder.frame = 0;
        g_app.recorder.capture = g_app.recorder.capture + 1;
      }
      g_app.recorder.on = (int)(g_app.recorder.on == 0);
    }
    else {
      if (key == 0x52) {
        loadBuffers();
        loadPrograms();
        return;
      }
      if (key == 0x100) {
        g_app.viewer.hud = (bool)(g_app.viewer.hud ^ 1);
      }
    }
  }
  return;
}

Assistant:

void
keyboardCallback(
    GLFWwindow*,
    int key, int, int action, int
) {
    ImGuiIO& io = ImGui::GetIO();
    if (io.WantCaptureKeyboard)
        return;

    if (action == GLFW_PRESS) {
        switch (key) {
        case GLFW_KEY_ESCAPE:
            g_app.viewer.hud = !g_app.viewer.hud;
            break;
        case GLFW_KEY_C:
            if (g_app.recorder.on) {
                g_app.recorder.frame = 0;
                ++g_app.recorder.capture;
            }
            g_app.recorder.on = !g_app.recorder.on;
            break;
        case GLFW_KEY_R:
            loadBuffers();
            loadPrograms();
            break;
        default: break;
        }
    }
}